

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O0

void INT_CMCondition_set_client_data(CManager cm,int condition,void *client_data)

{
  CMCondition p_Var1;
  CMControlList in_RDX;
  CMControlList cl;
  CMCondition cond;
  undefined8 in_stack_ffffffffffffffe0;
  int condition_00;
  
  condition_00 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  set_debug_flag((CManager)0x12a3c9);
  p_Var1 = CMCondition_find(in_RDX,condition_00);
  if (p_Var1 != (CMCondition)0x0) {
    p_Var1->client_data = in_RDX;
  }
  return;
}

Assistant:

extern void
INT_CMCondition_set_client_data(CManager cm, int condition, void *client_data)
{
    CMCondition cond;
    CMControlList cl = cm->control_list;
    set_debug_flag(cm);
    cond = CMCondition_find(cl, condition);
    if (!cond) return;
    cond->client_data = client_data;
}